

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O2

void test_ADynArray_insertArray_success_negativeIndexGetsMaxIndex_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  code *local_38;
  code *pcStack_30;
  code *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  
  local_38 = private_ACUtilsTest_ADynArray_realloc;
  pcStack_30 = private_ACUtilsTest_ADynArray_free;
  local_20 = (char *)0x5;
  local_28 = private_ACUtilsTest_ADynArray_growStrategy;
  local_18 = (char *)0x8;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  local_10 = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  builtin_strncpy(local_10,"01234",5);
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  bVar1 = private_ACUtils_ADynArray_insertArray(&local_38,0xffffffffffffffff,"56",3,1);
  if (bVar1 == true) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x388);
    if (local_20 == (char *)0x8) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x389);
      if (local_18 == (char *)0x8) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x38a);
        if (local_10 == (char *)0x0) {
          pcVar3 = (char *)0x0;
          pcVar7 = (char *)0x0;
          expr = "Assertion \'_ck_x != NULL\' failed";
          pcVar4 = "Assertion \'%s\' failed: %s == %#x";
          pcVar5 = "(void*) array.buffer != NULL";
          pcVar6 = "(void*) array.buffer";
          iVar2 = 0x38b;
        }
        else {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x38b);
          pcVar7 = local_10;
          if (local_10 == (char *)0x0) {
            pcVar3 = "";
            pcVar7 = "(null)";
          }
          else {
            iVar2 = strcmp("0123456",local_10);
            if (iVar2 == 0) {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x38c);
              if (local_28 == (code *)0x0) {
                pcVar3 = (char *)0x0;
                pcVar7 = (char *)0x0;
                expr = "Assertion \'_ck_x != NULL\' failed";
                pcVar4 = "Assertion \'%s\' failed: %s == %#x";
                pcVar5 = "(void*) array.growStrategy != NULL";
                pcVar6 = "(void*) array.growStrategy";
                iVar2 = 0x38d;
              }
              else {
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x38d);
                if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                              ,0x38e);
                  (*pcStack_30)(local_10);
                  return;
                }
                pcVar7 = "0";
                expr = "Assertion \'_ck_x == _ck_y\' failed";
                pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                pcVar5 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
                pcVar6 = "private_ACUtilsTest_ADynArray_reallocCount";
                iVar2 = 0x38e;
                pcVar3 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
              }
              goto LAB_00111993;
            }
            pcVar3 = "\"";
          }
          expr = 
          "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
          ;
          pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
          pcVar5 = "array.buffer == \"0123456\"";
          pcVar6 = "array.buffer";
          iVar2 = 0x38c;
        }
      }
      else {
        pcVar7 = "8";
        expr = "Assertion \'_ck_x == _ck_y\' failed";
        pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
        pcVar5 = "array.capacity == 8";
        pcVar6 = "array.capacity";
        iVar2 = 0x38a;
        pcVar3 = local_18;
      }
    }
    else {
      pcVar7 = "8";
      expr = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar5 = "array.size == 8";
      pcVar6 = "array.size";
      iVar2 = 0x389;
      pcVar3 = local_20;
    }
  }
  else {
    pcVar3 = (char *)(ulong)bVar1;
    pcVar7 = "true";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar5 = 
    "private_ACUtils_ADynArray_insertArray(&array, -1, \"56\\0\", 3, sizeof(*(&array)->buffer)) == true"
    ;
    pcVar6 = 
    "private_ACUtils_ADynArray_insertArray(&array, -1, \"56\\0\", 3, sizeof(*(&array)->buffer))";
    iVar2 = 0x388;
  }
LAB_00111993:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,expr,pcVar4,pcVar5,pcVar6,pcVar3,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_insertArray_success_negativeIndexGetsMaxIndex)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = 5;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = 8;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    memcpy(array.buffer, "01234", 5);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_insertArray(&array, -1, "56\0", 3), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 8);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "0123456");
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    array.deallocator(array.buffer);
}